

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

void __thiscall Scene::Scene(Scene *this)

{
  Scene *this_local;
  
  this->shadow_width = 0x1000;
  this->shadow_height = 0x1000;
  this->grid_width = 0x14;
  this->grid_height = 0x14;
  this->grid_start_x = -10;
  this->grid_start_y = -10;
  this->grid_cell_size = 1;
  std::vector<float,_std::allocator<float>_>::vector(&this->grid_vertices);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->grid_indices);
  return;
}

Assistant:

Scene::Scene() :
    grid_width(20),
    grid_height(20),
    grid_start_x(-10.0),
    grid_start_y(-10.0),
    grid_cell_size(1.0) {

}